

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setGeometry(QWidget *this,QRect *r)

{
  ushort *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar9;
  undefined4 uVar11;
  QWExtra *pQVar10;
  undefined4 uVar12;
  uint uVar13;
  QWidgetPrivate *d_3;
  int iVar14;
  int iVar15;
  int iVar16;
  QWidgetPrivate *d_2;
  QWidgetPrivate *pQVar17;
  QWidgetPrivate *d;
  undefined8 uVar18;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  uVar13 = this_00->high_attributes[0] | 0xc00;
  if ((~this_00->high_attributes[0] & 0xc00) != 0) {
    this_00->high_attributes[0] = uVar13;
  }
  pQVar17 = this_00;
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    QWidgetPrivate::createTLExtra(this_00);
    puVar1 = (ushort *)
             ((long)(((this_00->extra)._M_t.
                      super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                    super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
    *puVar1 = *puVar1 & 0xfeff;
    pQVar17 = *(QWidgetPrivate **)&this->field_0x8;
    uVar13 = pQVar17->high_attributes[0];
  }
  if ((uVar13 >> 0x1c & 1) == 0) {
    pQVar9 = this->data;
    iVar2 = (pQVar9->crect).x1.m_i;
    iVar3 = (pQVar9->crect).y1.m_i;
    iVar4 = (pQVar9->crect).x2.m_i;
    iVar5 = (pQVar9->crect).y2.m_i;
    uVar7 = r->x1;
    uVar11 = r->y1;
    (pQVar9->crect).x1 = (Representation)uVar7;
    (pQVar9->crect).y1 = (Representation)uVar11;
    iVar15 = ((r->x2).m_i - (r->x1).m_i) + 1;
    iVar14 = ((r->y2).m_i - (r->y1).m_i) + 1;
    pQVar10 = (pQVar17->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
              _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
              super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar10 == (QWExtra *)0x0) {
      if (0xfffffe < iVar15) {
        iVar15 = 0xffffff;
      }
      iVar16 = 0xffffff;
      if (iVar14 < 0xffffff) {
        iVar16 = iVar14;
      }
      uVar18 = 0;
    }
    else {
      uVar8 = pQVar10->maxw;
      uVar12 = pQVar10->maxh;
      if ((int)uVar8 <= iVar15) {
        iVar15 = uVar8;
      }
      uVar18._0_4_ = pQVar10->minw;
      uVar18._4_4_ = pQVar10->minh;
      iVar16 = uVar12;
      if (iVar14 < (int)uVar12) {
        iVar16 = iVar14;
      }
    }
    if (iVar15 <= (int)uVar18) {
      iVar15 = (int)uVar18;
    }
    iVar14 = (int)((ulong)uVar18 >> 0x20);
    if (iVar14 < iVar16) {
      iVar14 = iVar16;
    }
    (pQVar9->crect).x2.m_i = uVar7 + -1 + iVar15;
    (pQVar9->crect).y2.m_i = uVar11 + iVar14 + -1;
    pQVar9 = this->data;
    if ((((iVar2 != (pQVar9->crect).x1.m_i) || (iVar4 != (pQVar9->crect).x2.m_i)) ||
        (iVar3 != (pQVar9->crect).y1.m_i)) || (iVar5 != (pQVar9->crect).y2.m_i)) {
      uVar6 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
      if ((~uVar6 & 0xc) != 0) {
        *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar6 | 0xc;
      }
    }
  }
  else {
    iVar2 = (r->x1).m_i;
    iVar3 = (r->y1).m_i;
    QWidgetPrivate::setGeometry_sys
              (this_00,iVar2,iVar3,((r->x2).m_i - iVar2) + 1,((r->y2).m_i - iVar3) + 1,true);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
  }
  pQVar10 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
            .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
            super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar10 != (QWExtra *)0x0) && ((pQVar10->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasMoved(this);
    return;
  }
  return;
}

Assistant:

void QWidget::setGeometry(const QRect &r)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_Resized);
    setAttribute(Qt::WA_Moved);
    if (isWindow())
        d->topData()->posIncludesFrame = 0;
    if (testAttribute(Qt::WA_WState_Created)) {
        d->setGeometry_sys(r.x(), r.y(), r.width(), r.height(), true);
        d->setDirtyOpaqueRegion();
    } else {
        const auto oldRect = data->crect;
        data->crect.setTopLeft(r.topLeft());
        data->crect.setSize(r.size().boundedTo(maximumSize()).expandedTo(minimumSize()));
        if (oldRect != data->crect) {
            setAttribute(Qt::WA_PendingMoveEvent);
            setAttribute(Qt::WA_PendingResizeEvent);
        }
    }

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasMoved(this);
}